

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

bool __thiscall
glcts::ViewportArray::DrawTestBase::checkRegionR32I
          (DrawTestBase *this,GLuint x,GLuint y,GLuint width,GLuint height,GLint expected_value,
          GLint *data)

{
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar1;
  MessageBuilder local_1c0;
  int local_40;
  uint local_3c;
  GLint value;
  GLuint texel_offset;
  GLuint texel;
  GLuint line_offset;
  GLuint line;
  GLuint offset;
  GLuint GStack_20;
  bool result;
  GLint expected_value_local;
  GLuint height_local;
  GLuint width_local;
  GLuint y_local;
  GLuint x_local;
  DrawTestBase *this_local;
  
  line._3_1_ = 1;
  line_offset = y * height * 0x80 + x * width;
  texel = 0;
  do {
    if (height <= texel) {
      return true;
    }
    texel_offset = line_offset + texel * 0x80;
    for (value = 0; (uint)value < width; value = value + 1) {
      local_3c = texel_offset + value;
      local_40 = data[local_3c];
      if (expected_value != local_40) {
        offset = expected_value;
        GStack_20 = height;
        expected_value_local = width;
        height_local = y;
        width_local = x;
        _y_local = this;
        this_00 = deqp::Context::getTestContext((this->super_TestCaseBase).m_context);
        this_01 = tcu::TestContext::getLog(this_00);
        tcu::TestLog::operator<<(&local_1c0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar1 = tcu::MessageBuilder::operator<<
                           (&local_1c0,(char (*) [25])"Invalid result. Region (");
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&width_local);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2a9098a);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&height_local);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [14])"). Expected: ");
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(int *)&offset);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [6])0x2b957f7);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_40);
        tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1c0);
        return false;
      }
    }
    texel = texel + 1;
  } while( true );
}

Assistant:

bool DrawTestBase::checkRegionR32I(GLuint x, GLuint y, GLuint width, GLuint height, GLint expected_value, GLint* data)
{
	bool result = true;

	const GLuint offset = (y * height * m_width) + (x * width);

	for (GLuint line = 0; line < height; ++line)
	{
		const GLuint line_offset = offset + line * m_width;

		for (GLuint texel = 0; texel < width; ++texel)
		{
			const GLuint texel_offset = line_offset + texel;

			const GLint value = data[texel_offset];

			if (expected_value != value)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid result. Region (" << x << "x"
													<< y << "). Expected: " << expected_value << " got " << value
													<< tcu::TestLog::EndMessage;

				result = false;
				goto end;
			}
		}
	}

end:
	return result;
}